

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t io::net::read<io::basic_string_stream<char,std::char_traits<char>>,io::net::transfer_all>
                 (memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                  *stream,mutable_buffer *buffer,error_code *param_3)

{
  size_t sVar1;
  undefined1 local_50 [8];
  mutable_buffer buf;
  size_t buf_size;
  size_t next_read_size;
  size_t total_bytes_read;
  error_code *ec_local;
  mutable_buffer *buffer_local;
  basic_string_stream<char,_std::char_traits<char>_> *stream_local;
  
  std::error_code::clear(param_3);
  next_read_size = 0;
  buf_size = 0x10000;
  buf.size_ = buffer_size(buffer);
  while (next_read_size < buf.size_ && buf_size != 0) {
    _local_50 = operator+(buffer,next_read_size);
    sVar1 = detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
            ::read_some<io::net::mutable_buffer>(stream,(mutable_buffer *)local_50,param_3);
    next_read_size = sVar1 + next_read_size;
    buf_size = transfer_all::operator()
                         ((transfer_all *)((long)&stream_local + 7),param_3,next_read_size);
  }
  return next_read_size;
}

Assistant:

std::size_t read(SyncReadStream& stream,
                 const mutable_buffer& buffer,
                 CompletionCondition completion_condition,
                 std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_read = 0;
    std::size_t next_read_size = max_single_transfer_size;
    std::size_t buf_size = buffer_size(buffer);

    while (total_bytes_read < buf_size && next_read_size != 0) {
        mutable_buffer buf = buffer + total_bytes_read;
        total_bytes_read += stream.read_some(buf, ec);
        next_read_size = completion_condition(ec, total_bytes_read);
    }

    return total_bytes_read;

}